

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playGround.cpp
# Opt level: O1

void __thiscall PlayGround::kill_agent(PlayGround *this)

{
  bool *pbVar1;
  pair<int,_int> *ppVar2;
  int iVar3;
  int iVar4;
  pointer pvVar5;
  long lVar6;
  iterator iVar7;
  bool bVar8;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  long extraout_RDX;
  PlayGround *unaff_RBX;
  ulong uVar13;
  pair<int,_int> pVar14;
  pair<int,_int> locationn;
  pair<int,_int> locationn_00;
  pair<int,_int> locationn_01;
  pair<int,_int> locationn_02;
  char *this_00;
  Room room;
  sensor sStack_6c;
  undefined1 auStack_60 [24];
  PlayGround *pPStack_48;
  undefined1 local_18 [16];
  
  uVar13 = (long)(this->playableworld).agent_location.second - 1;
  pvVar5 = (this->playableworld).world.boxes.
           super__Vector_base<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((long)(this->playableworld).world.boxes.
                  super__Vector_base<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
           -0x5555555555555555;
  uVar9 = uVar13;
  if (uVar13 <= uVar11 && uVar11 - uVar13 != 0) {
    uVar9 = (long)(this->playableworld).agent_location.first - 1;
    lVar12 = *(long *)&pvVar5[uVar13].super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                       super__Vector_impl_data;
    unaff_RBX = this;
    if (uVar9 < (ulong)((long)*(pointer *)
                               ((long)&pvVar5[uVar13].
                                       super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                                       super__Vector_impl_data + 8) - lVar12 >> 4)) {
      ppVar2 = (pair<int,_int> *)(lVar12 + uVar9 * 0x10);
      local_18._0_8_ = *ppVar2;
      local_18._8_8_ = ppVar2[1];
      bVar8 = Room::has_wumpus((Room *)local_18);
      if ((bVar8) || (bVar8 = Room::has_pit((Room *)local_18), bVar8)) {
        this->is_agent_dead = true;
      }
      return;
    }
  }
  this_00 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  iVar3 = *(int *)(uVar9 + 0xf4);
  uVar11 = (long)iVar3 - 1;
  lVar12 = *(long *)(uVar9 + 0xb8);
  uVar13 = (*(long *)(uVar9 + 0xc0) - lVar12 >> 3) * -0x5555555555555555;
  pPStack_48 = unaff_RBX;
  if (uVar11 <= uVar13 && uVar13 - uVar11 != 0) {
    iVar4 = *(int *)(uVar9 + 0xf0);
    lVar6 = *(long *)(lVar12 + uVar11 * 0x18);
    if ((long)iVar4 - 1U < (ulong)(*(long *)(lVar12 + 8 + uVar11 * 0x18) - lVar6 >> 4)) {
      ppVar2 = (pair<int,_int> *)(lVar6 + ((long)iVar4 - 1U) * 0x10);
      auStack_60._0_8_ = *ppVar2;
      auStack_60._8_8_ = ppVar2[1];
      ((PlayGround *)this_00)->point = 0;
      ((PlayGround *)this_00)->move = false;
      ((PlayGround *)this_00)->shoot = false;
      (((PlayGround *)this_00)->p).stench = false;
      (((PlayGround *)this_00)->p).breeze = false;
      *(undefined8 *)&(((PlayGround *)this_00)->p).glitter = 0;
      *(undefined8 *)&(((PlayGround *)this_00)->action).turnright = 0;
      bVar8 = Room::get_breeze((Room *)auStack_60);
      if (bVar8) {
        pVar14.second = iVar3;
        pVar14.first = iVar4;
        sensor::sensor(&sStack_6c,pVar14,B);
        iVar7._M_current = *(sensor **)&(((PlayGround *)this_00)->p).glitter;
        if (iVar7._M_current == *(sensor **)&(((PlayGround *)this_00)->action).turnright) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)this_00,iVar7,&sStack_6c);
        }
        else {
          (iVar7._M_current)->sense = sStack_6c.sense;
          (iVar7._M_current)->location = sStack_6c.location;
          pbVar1 = &(((PlayGround *)this_00)->p).glitter;
          *(long *)pbVar1 = *(long *)pbVar1 + 0xc;
        }
        *(undefined1 *)(uVar9 + 7) = 1;
      }
      bVar8 = Room::get_stench((Room *)auStack_60);
      if (bVar8) {
        locationn.second = iVar3;
        locationn.first = iVar4;
        sensor::sensor(&sStack_6c,locationn,S);
        iVar7._M_current = *(sensor **)&(((PlayGround *)this_00)->p).glitter;
        if (iVar7._M_current == *(sensor **)&(((PlayGround *)this_00)->action).turnright) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)this_00,iVar7,&sStack_6c);
        }
        else {
          (iVar7._M_current)->sense = sStack_6c.sense;
          (iVar7._M_current)->location = sStack_6c.location;
          pbVar1 = &(((PlayGround *)this_00)->p).glitter;
          *(long *)pbVar1 = *(long *)pbVar1 + 0xc;
        }
        *(undefined1 *)(uVar9 + 6) = 1;
      }
      bVar8 = Room::get_glitter((Room *)auStack_60);
      if (bVar8) {
        locationn_00.second = iVar3;
        locationn_00.first = iVar4;
        sensor::sensor(&sStack_6c,locationn_00,G);
        iVar7._M_current = *(sensor **)&(((PlayGround *)this_00)->p).glitter;
        if (iVar7._M_current == *(sensor **)&(((PlayGround *)this_00)->action).turnright) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)this_00,iVar7,&sStack_6c);
        }
        else {
          (iVar7._M_current)->sense = sStack_6c.sense;
          (iVar7._M_current)->location = sStack_6c.location;
          pbVar1 = &(((PlayGround *)this_00)->p).glitter;
          *(long *)pbVar1 = *(long *)pbVar1 + 0xc;
        }
        *(undefined1 *)(uVar9 + 0xe) = 1;
        *(undefined1 *)(uVar9 + 8) = 1;
      }
      bVar8 = Room::has_pit((Room *)auStack_60);
      if (bVar8) {
        locationn_01.second = iVar3;
        locationn_01.first = iVar4;
        sensor::sensor(&sStack_6c,locationn_01,P);
        iVar7._M_current = *(sensor **)&(((PlayGround *)this_00)->p).glitter;
        if (iVar7._M_current == *(sensor **)&(((PlayGround *)this_00)->action).turnright) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)this_00,iVar7,&sStack_6c);
        }
        else {
          (iVar7._M_current)->sense = sStack_6c.sense;
          (iVar7._M_current)->location = sStack_6c.location;
          pbVar1 = &(((PlayGround *)this_00)->p).glitter;
          *(long *)pbVar1 = *(long *)pbVar1 + 0xc;
        }
      }
      bVar8 = Room::has_wumpus((Room *)auStack_60);
      if (bVar8) {
        locationn_02.second = iVar3;
        locationn_02.first = iVar4;
        sensor::sensor(&sStack_6c,locationn_02,W);
        iVar7._M_current = *(sensor **)&(((PlayGround *)this_00)->p).glitter;
        if (iVar7._M_current == *(sensor **)&(((PlayGround *)this_00)->action).turnright) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)this_00,iVar7,&sStack_6c);
        }
        else {
          (iVar7._M_current)->sense = sStack_6c.sense;
          (iVar7._M_current)->location = sStack_6c.location;
          pbVar1 = &(((PlayGround *)this_00)->p).glitter;
          *(long *)pbVar1 = *(long *)pbVar1 + 0xc;
        }
        *(undefined1 *)(uVar9 + 0xb) = 1;
      }
      if (*(char *)(uVar9 + 0xc) != '\x01') {
        return;
      }
      lVar12 = *(long *)&(((PlayGround *)this_00)->p).glitter - (long)*(sensor **)this_00;
      unaff_RBX = (PlayGround *)this_00;
      if (lVar12 != 0) {
        pVar14 = sensor::get_Location(*(sensor **)this_00);
        sensor::sensor(&sStack_6c,pVar14,scream);
        *(undefined1 *)(uVar9 + 10) = 1;
        return;
      }
      goto LAB_00107048;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  lVar12 = extraout_RDX;
LAB_00107048:
  uVar10 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                      (lVar12 >> 2) * -0x5555555555555555);
  if (*(void **)unaff_RBX != (void *)0x0) {
    operator_delete(*(void **)unaff_RBX);
  }
  _Unwind_Resume(uVar10);
}

Assistant:

void PlayGround::kill_agent()
{
    pair<int, int> agent_location = make_pair(playableworld.agent_location.first - 1, playableworld.agent_location.second - 1);
    Room room = playableworld.world.boxes.at(agent_location.second).at(agent_location.first);
    if (room.has_wumpus() || room.has_pit())
    {
        is_agent_dead = true;
    }
}